

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int twacf(double *P,int MP,double *Q,int MQ,double *ACF,int MA,double *CVLI,int MXPQ1,double *ALPHA,
         int MXPQ)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double div;
  double two;
  double half;
  double one;
  double zero;
  double epsil2;
  int kp1mj;
  int mikp;
  int imj;
  int miim1p;
  int kp2mj;
  int kp1;
  int j1;
  int kcp1mj;
  int jpk;
  int j;
  int kc;
  int k;
  int i;
  int ifault;
  int MA_local;
  double *ACF_local;
  int MQ_local;
  double *Q_local;
  int MP_local;
  double *P_local;
  
  k = 0;
  if ((MP < 0) || (MQ < 0)) {
    k = 1;
  }
  iVar2 = imax(MP,MQ);
  if (MXPQ != iVar2) {
    k = 2;
  }
  if (MXPQ1 != MXPQ + 1) {
    k = 3;
  }
  if (MA < MXPQ1) {
    k = 4;
  }
  if (k == 0) {
    *ACF = 1.0;
    *CVLI = 1.0;
    if (MA != 1) {
      for (kc = 1; kc < MA; kc = kc + 1) {
        ACF[kc] = 0.0;
      }
      if (MXPQ1 != 1) {
        for (kc = 1; kc < MXPQ1; kc = kc + 1) {
          CVLI[kc] = 0.0;
        }
        for (j = 0; j < MXPQ; j = j + 1) {
          ALPHA[j] = 0.0;
        }
        if (MQ != 0) {
          for (j = 1; j <= MQ; j = j + 1) {
            CVLI[j] = -Q[j + -1];
            ACF[j] = -Q[j + -1];
            if (MQ != j) {
              for (kcp1mj = 1; kcp1mj <= MQ - j; kcp1mj = kcp1mj + 1) {
                ACF[j] = Q[kcp1mj + -1] * Q[kcp1mj + j + -1] + ACF[j];
              }
            }
            *ACF = Q[j + -1] * Q[j + -1] + *ACF;
          }
        }
        if (MP != 0) {
          for (j = 0; j < MP; j = j + 1) {
            ALPHA[j] = P[j];
            CVLI[j] = P[j];
          }
          for (j = 1; j <= MXPQ; j = j + 1) {
            iVar2 = MXPQ - j;
            if (iVar2 < MP) {
              dVar3 = -ALPHA[iVar2] * ALPHA[iVar2] + 1.0;
              if (dVar3 <= 1e-10) {
                return 5;
              }
              if (iVar2 == 0) break;
              for (kcp1mj = 1; kcp1mj <= iVar2; kcp1mj = kcp1mj + 1) {
                ALPHA[kcp1mj + -1] =
                     (ALPHA[iVar2] * CVLI[iVar2 - kcp1mj] + CVLI[kcp1mj + -1]) / dVar3;
              }
            }
            if (iVar2 < MQ) {
              for (kcp1mj = imax((iVar2 + 1) - MP,1); kcp1mj <= iVar2; kcp1mj = kcp1mj + 1) {
                ACF[kcp1mj] = ACF[iVar2 + 1] * ALPHA[iVar2 - kcp1mj] + ACF[kcp1mj];
              }
            }
            if (iVar2 < MP) {
              for (kcp1mj = 1; kcp1mj <= iVar2; kcp1mj = kcp1mj + 1) {
                CVLI[kcp1mj + -1] = ALPHA[kcp1mj + -1];
              }
            }
          }
          *ACF = *ACF * 0.5;
          for (j = 1; j <= MXPQ; j = j + 1) {
            if (j <= MP) {
              dVar3 = ALPHA[j + -1];
              dVar1 = ALPHA[j + -1];
              for (kcp1mj = 1; kcp1mj <= j + 1; kcp1mj = kcp1mj + 1) {
                CVLI[kcp1mj + -1] =
                     (ALPHA[j + -1] * ACF[(j - kcp1mj) + 1] + ACF[kcp1mj + -1]) /
                     (-dVar3 * dVar1 + 1.0);
              }
              for (kcp1mj = 1; kcp1mj <= j + 1; kcp1mj = kcp1mj + 1) {
                ACF[kcp1mj + -1] = CVLI[kcp1mj + -1];
              }
            }
          }
          for (kc = 1; kc <= MA; kc = kc + 1) {
            iVar2 = imin(kc + -1,MP);
            if (iVar2 != 0) {
              for (kcp1mj = 1; kcp1mj <= iVar2; kcp1mj = kcp1mj + 1) {
                ACF[kc + -1] = P[kcp1mj + -1] * ACF[(kc - kcp1mj) + -1] + ACF[kc + -1];
              }
            }
          }
          *ACF = *ACF * 2.0;
          *CVLI = 1.0;
          if (0 < MQ) {
            for (j = 1; j <= MQ; j = j + 1) {
              CVLI[j] = -Q[j + -1];
              if (MP != 0) {
                iVar2 = imin(j,MP);
                for (kcp1mj = 1; kcp1mj <= iVar2; kcp1mj = kcp1mj + 1) {
                  CVLI[j] = P[kcp1mj + -1] * CVLI[j - kcp1mj] + CVLI[j];
                }
              }
            }
          }
        }
      }
    }
  }
  return k;
}

Assistant:

int twacf(double *P, int MP, double *Q, int MQ, double *ACF, int MA, double *CVLI, int MXPQ1, double *ALPHA, int MXPQ) {
	int ifault, i, k, kc, j, jpk, kcp1mj, j1, kp1, kp2mj, miim1p, imj, mikp, kp1mj;
	double epsil2, zero, one, half, two, div;

	ifault = 0;
	epsil2 = 1.0e-10;
	zero = 0.0; half = 0.5, one = 1.0, two = 2.0;

	if (MP < 0 || MQ < 0) {
		ifault = 1;
	}
	if (MXPQ != imax(MP, MQ)) {
		ifault = 2;
	}
	if (MXPQ1 != MXPQ + 1) {
		ifault = 3;
	}
	if (MA < MXPQ1) {
		ifault = 4;
	}

	if (ifault > 0) {
		return ifault;
	}

	// Initialization and return if MP = MQ = 0

	ACF[0] = one;
	CVLI[0] = one;

	if (MA == 1) {
		return ifault;
	}

	for (i = 1; i < MA; ++i) {
		ACF[i] = zero;
	}

	if (MXPQ1 == 1) {
		return ifault;
	}

	for (i = 1; i < MXPQ1; ++i) {
		CVLI[i] = zero;
	}
	for (k = 0; k < MXPQ; ++k) {
		ALPHA[k] = 0.0;
	}

	// Computation of the A.C.F. of the moving average part stored in ACF

	if (MQ != 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			ACF[k] = -Q[k - 1];
			kc = MQ - k;
			if (kc != 0) {
				for (j = 1; j <= kc; ++j) {
					jpk = j + k;
					ACF[k] += (Q[j - 1] * Q[jpk - 1]);
				}
			}//120
			ACF[0] += (Q[k - 1] * Q[k - 1]);
		}

		//Initialization of CVLI = T.W.-S.PHI -- return if MP = 0
	}//180

	if (MP == 0) {
		return ifault;
	}

	for (k = 0; k < MP; ++k) {
		ALPHA[k] = P[k];
		CVLI[k] = P[k];
	}

	// Computation of T.W.-S ALPHA and DELTA
	// DELTA stored in ACF which is gradually overwritten

	for (k = 1; k <= MXPQ; ++k) {
		kc = MXPQ - k;
		if (kc < MP) {
			div = one - ALPHA[kc] * ALPHA[kc];
			if (div <= epsil2) {
				return 5;
			}
			if (kc == 0) {
				break; //break For loop. Go to 290
			}//290
			for (j = 1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ALPHA[j - 1] = (CVLI[j - 1] + ALPHA[kc] * CVLI[kcp1mj]) / div;
			}
		}//240
		if (kc < MQ) {
			j1 = imax(kc + 1 - MP, 1);
			for (j = j1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ACF[j] += ACF[kc + 1] * ALPHA[kcp1mj];
			}
		}//260
		if (kc < MP) {
			for (j = 1; j <= kc; ++j) {
				CVLI[j - 1] = ALPHA[j - 1];
			}
		}
	}//290

	// Computation of T.W.-S NU
	// NU is stored in CVLI copied into ACF

	ACF[0] *= half;
	for (k = 1; k <= MXPQ; ++k) {
		if (k <= MP) {
			kp1 = k + 1;
			div = one - ALPHA[k - 1] * ALPHA[k - 1];
			for (j = 1; j <= kp1; ++j) {
				kp2mj = k + 2 - j;
				CVLI[j - 1] = (ACF[j - 1] + ALPHA[k - 1] * ACF[kp2mj - 1]) / div;
			}
			for (j = 1; j <= kp1; ++j) {
				ACF[j - 1] = CVLI[j - 1];
			}
		}//330
	}//330

	//Computation of ACF

	for (i = 1; i <= MA; ++i) {
		miim1p = imin(i - 1, MP);
		if (miim1p != 0) {
			for (j = 1; j <= miim1p; ++j) {
				imj = i - j; 
				ACF[i - 1] += P[j - 1] * ACF[imj - 1];
			}
		}//430
	}//430

	ACF[0] *= two;

	//Computation of CVLI

	CVLI[0] = one;
	if (MQ > 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			if (MP != 0) {
				mikp = imin(k, MP);
				for (j = 1; j <= mikp; ++j) {
					kp1mj = k + 1 - j;
					CVLI[k] += P[j - 1] * CVLI[kp1mj - 1];
				}
			}
		}
	}

	return ifault;
}